

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void __thiscall QDirSortItem::QDirSortItem(QDirSortItem *this,QFileInfo *fi,SortFlags sort)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->suffix_cache).d.ptr = (char16_t *)0x0;
  (this->suffix_cache).d.size = 0;
  (this->filename_cache).d.size = 0;
  (this->suffix_cache).d.d = (Data *)0x0;
  (this->filename_cache).d.d = (Data *)0x0;
  (this->filename_cache).d.ptr = (char16_t *)0x0;
  QFileInfo::QFileInfo(&this->item,fi);
  if ((char)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
      < '\0') {
    QFileInfo::suffix(&local_48,&this->item);
    data = &((this->suffix_cache).d.d)->super_QArrayData;
    pcVar1 = (this->suffix_cache).d.ptr;
    (this->suffix_cache).d.d = local_48.d.d;
    (this->suffix_cache).d.ptr = local_48.d.ptr;
    qVar2 = (this->suffix_cache).d.size;
    (this->suffix_cache).d.size = local_48.d.size;
    local_48.d.d = (Data *)data;
    local_48.d.ptr = pcVar1;
    local_48.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirSortItem(const QFileInfo &fi, QDir::SortFlags sort)
        : item(fi)
    {
        // A dir e.g. "dirA.bar" doesn't have actually have an extension/suffix, when
        // sorting by type such "suffix" should be ignored but that would complicate
        // the code and uses can change the behavior by setting DirsFirst/DirsLast
        if (sort.testAnyFlag(QDir::Type))
            suffix_cache = item.suffix();
    }